

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::PopFont(void)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  ImFont *unaff_retaddr;
  ImGuiContext *g;
  ImDrawList *in_stack_fffffffffffffff0;
  
  pIVar1 = GImGui;
  ImDrawList::PopTextureID(in_stack_fffffffffffffff0);
  ImVector<ImFont_*>::pop_back(&pIVar1->FontStack);
  bVar2 = ImVector<ImFont_*>::empty(&pIVar1->FontStack);
  if (bVar2) {
    GetDefaultFont();
  }
  else {
    ImVector<ImFont_*>::back(&pIVar1->FontStack);
  }
  SetCurrentFont(unaff_retaddr);
  return;
}

Assistant:

void  ImGui::PopFont()
{
    ImGuiContext& g = *GImGui;
    g.CurrentWindow->DrawList->PopTextureID();
    g.FontStack.pop_back();
    SetCurrentFont(g.FontStack.empty() ? GetDefaultFont() : g.FontStack.back());
}